

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O1

void __thiscall arangodb::velocypack::Builder::addUTCDate(Builder *this,int64_t v)

{
  ValueLength *pVVar1;
  ValueLength VVar2;
  long lVar3;
  
  reserve(this,9);
  VVar2 = this->_pos;
  this->_pos = VVar2 + 1;
  this->_start[VVar2] = '\x1c';
  pVVar1 = &this->_bufferPtr->_size;
  *pVVar1 = *pVVar1 + 1;
  lVar3 = 8;
  do {
    VVar2 = this->_pos;
    this->_pos = VVar2 + 1;
    this->_start[VVar2] = (uint8_t)v;
    pVVar1 = &this->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + 1;
    v = (ulong)v >> 8;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  return;
}

Assistant:

void addUTCDate(int64_t v) {
    constexpr uint8_t vSize = sizeof(int64_t);  // is always 8
    reserve(1 + vSize);
    appendByteUnchecked(0x1c);
    appendLengthUnchecked<vSize>(toUInt64(v));
  }